

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

void output_header(FILE *fp,char *prog)

{
  int iVar1;
  int iVar2;
  
  iVar1 = fprintf((FILE *)fp,"%-10s%-40s %9s %8s  %8s %8s\n","Benchmark",prog,"ops","time","ops/sec"
                  ,"time/op");
  for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    putc(0x2d,(FILE *)fp);
  }
  putc(10,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

static void output_header (FILE *fp, const char *prog) {
	int i;
	int hdrlen = fprintf (fp, "%-10s%-40s %9s %8s  %8s %8s\n", "Benchmark", prog, "ops", "time",
			      "ops/sec", "time/op");
	for (i = 1; i < hdrlen; i++) {
		putc ('-', fp);
	}
	putc ('\n', fp);
	fflush (fp);
}